

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# play.c
# Opt level: O0

void xm_sample(xm_context_t *ctx,float *left,float *right)

{
  long lVar1;
  float *in_RDX;
  float *in_RSI;
  long in_RDI;
  float fVar2;
  float fgvol;
  float fval;
  xm_channel_context_t *ch;
  uint8_t i;
  byte local_19;
  
  if (*(float *)(in_RDI + 0x140) <= 0.0) {
    xm_tick((xm_context_t *)ch);
  }
  *(float *)(in_RDI + 0x140) = *(float *)(in_RDI + 0x140) + -1.0;
  *in_RSI = 0.0;
  *in_RDX = 0.0;
  if ((*(char *)(in_RDI + 0x161) == '\0') || (*(byte *)(in_RDI + 0x160) < *(byte *)(in_RDI + 0x161))
     ) {
    for (local_19 = 0; (ushort)local_19 < *(ushort *)(in_RDI + 0xc); local_19 = local_19 + 1) {
      lVar1 = *(long *)(in_RDI + 0x168) + (long)(int)(uint)local_19 * 0x138;
      if (((*(long *)(lVar1 + 8) != 0) && (*(long *)(lVar1 + 0x10) != 0)) &&
         (0.0 < *(float *)(lVar1 + 0x20) || *(float *)(lVar1 + 0x20) == 0.0)) {
        fVar2 = xm_next_of_sample((xm_channel_context_t *)left);
        if (((*(byte *)(lVar1 + 0x98) & 1) == 0) &&
           ((*(byte *)(*(long *)(lVar1 + 8) + 0xe8) & 1) == 0)) {
          *in_RSI = fVar2 * *(float *)(lVar1 + 0x130) + *in_RSI;
          *in_RDX = fVar2 * *(float *)(lVar1 + 0x134) + *in_RDX;
        }
        *(long *)(lVar1 + 0xa8) = *(long *)(lVar1 + 0xa8) + 1;
        if (*(float *)(lVar1 + 0x130) < *(float *)(lVar1 + 0x9c) ||
            *(float *)(lVar1 + 0x130) == *(float *)(lVar1 + 0x9c)) {
          if ((*(float *)(lVar1 + 0x130) < *(float *)(lVar1 + 0x9c)) &&
             (*(float *)(lVar1 + 0x130) = *(float *)(in_RDI + 0x138) + *(float *)(lVar1 + 0x130),
             *(float *)(lVar1 + 0x9c) <= *(float *)(lVar1 + 0x130) &&
             *(float *)(lVar1 + 0x130) != *(float *)(lVar1 + 0x9c))) {
            *(undefined4 *)(lVar1 + 0x130) = *(undefined4 *)(lVar1 + 0x9c);
          }
        }
        else {
          *(float *)(lVar1 + 0x130) = *(float *)(lVar1 + 0x130) - *(float *)(in_RDI + 0x138);
          if (*(float *)(lVar1 + 0x130) < *(float *)(lVar1 + 0x9c)) {
            *(undefined4 *)(lVar1 + 0x130) = *(undefined4 *)(lVar1 + 0x9c);
          }
        }
        if (*(float *)(lVar1 + 0x134) < *(float *)(lVar1 + 0xa0) ||
            *(float *)(lVar1 + 0x134) == *(float *)(lVar1 + 0xa0)) {
          if ((*(float *)(lVar1 + 0x134) < *(float *)(lVar1 + 0xa0)) &&
             (*(float *)(lVar1 + 0x134) = *(float *)(in_RDI + 0x138) + *(float *)(lVar1 + 0x134),
             *(float *)(lVar1 + 0xa0) <= *(float *)(lVar1 + 0x134) &&
             *(float *)(lVar1 + 0x134) != *(float *)(lVar1 + 0xa0))) {
            *(undefined4 *)(lVar1 + 0x134) = *(undefined4 *)(lVar1 + 0xa0);
          }
        }
        else {
          *(float *)(lVar1 + 0x134) = *(float *)(lVar1 + 0x134) - *(float *)(in_RDI + 0x138);
          if (*(float *)(lVar1 + 0x134) < *(float *)(lVar1 + 0xa0)) {
            *(undefined4 *)(lVar1 + 0x134) = *(undefined4 *)(lVar1 + 0xa0);
          }
        }
      }
    }
    fVar2 = *(float *)(in_RDI + 0x130) * *(float *)(in_RDI + 0x134);
    *in_RSI = fVar2 * *in_RSI;
    *in_RDX = fVar2 * *in_RDX;
    if ((1.0 < ABS(*in_RSI)) || (1.0 < ABS(*in_RDX))) {
      fprintf(_stderr,"%s(): clipping frame: %f %f, this is a bad module or a libxm bug\n",
              (double)*in_RSI,SUB84((double)*in_RDX,0),"xm_sample");
      fflush(_stderr);
    }
  }
  return;
}

Assistant:

static void xm_sample(xm_context_t* ctx, float* left, float* right) {
	if(ctx->remaining_samples_in_tick <= 0) {
		xm_tick(ctx);
	}
	ctx->remaining_samples_in_tick--;

	*left = 0.f;
	*right = 0.f;

	if(ctx->max_loop_count > 0 && ctx->loop_count >= ctx->max_loop_count) {
		return;
	}

	for(uint8_t i = 0; i < ctx->module.num_channels; ++i) {
		xm_channel_context_t* ch = ctx->channels + i;

		if(ch->instrument == NULL || ch->sample == NULL || ch->sample_position < 0) {
			continue;
		}

		const float fval = xm_next_of_sample(ch);

		if(!ch->muted && !ch->instrument->muted) {
			*left += fval * ch->actual_volume[0];
			*right += fval * ch->actual_volume[1];
		}

#if XM_RAMPING
		ch->frame_count++;
		XM_SLIDE_TOWARDS(ch->actual_volume[0], ch->target_volume[0], ctx->volume_ramp);
		XM_SLIDE_TOWARDS(ch->actual_volume[1], ch->target_volume[1], ctx->volume_ramp);
#endif
	}

	const float fgvol = ctx->global_volume * ctx->amplification;
	*left *= fgvol;
	*right *= fgvol;

	if(XM_DEBUG) {
		if(fabs(*left) > 1 || fabs(*right) > 1) {
			DEBUG("clipping frame: %f %f, this is a bad module or a libxm bug", *left, *right);
		}
	}
}